

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

int Bac_PtrMemory(Vec_Ptr_t *vDes)

{
  int iVar1;
  Vec_Ptr_t *vNtk_00;
  double dVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int nBytes;
  int i;
  Vec_Ptr_t *vNtk;
  Vec_Ptr_t *vDes_local;
  
  dVar2 = Vec_PtrMemory(vDes);
  local_20 = (int)dVar2;
  for (local_1c = 1; iVar1 = Vec_PtrSize(vDes), local_1c < iVar1; local_1c = local_1c + 1) {
    vNtk_00 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,local_1c);
    iVar1 = Bac_PtrMemoryNtk(vNtk_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Bac_PtrMemory( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i, nBytes = (int)Vec_PtrMemory(vDes);
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        nBytes += Bac_PtrMemoryNtk(vNtk);
    return nBytes;
}